

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArrayImageTextureSize.cpp
# Opt level: O0

void __thiscall
glcts::TextureCubeMapArrayTextureSizeRTBase::deleteTestSpecificObjects
          (TextureCubeMapArrayTextureSizeRTBase *this)

{
  int iVar1;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  Functions *gl;
  TextureCubeMapArrayTextureSizeRTBase *this_local;
  long lVar3;
  
  pRVar2 = deqp::Context::getRenderContext
                     ((this->super_TextureCubeMapArrayTextureSizeBase).super_TestCaseBase.m_context)
  ;
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  (**(code **)(lVar3 + 0x78))(0x8ca8,0);
  (**(code **)(lVar3 + 8))(0x84c0);
  (**(code **)(lVar3 + 0xb8))(0xde1,0);
  (**(code **)(lVar3 + 8))(0x84c1);
  (**(code **)(lVar3 + 0xb8))(0xde1,0);
  (**(code **)(lVar3 + 8))(0x84c0);
  if (this->m_read_fbo_id != 0) {
    (**(code **)(lVar3 + 0x440))(1,&this->m_read_fbo_id);
    this->m_read_fbo_id = 0;
  }
  if (this->m_rt_std_id != 0) {
    (**(code **)(lVar3 + 0x480))(1,&this->m_rt_std_id);
    this->m_rt_std_id = 0;
  }
  if (this->m_rt_shw_id != 0) {
    (**(code **)(lVar3 + 0x480))(1,&this->m_rt_shw_id);
    this->m_rt_shw_id = 0;
  }
  return;
}

Assistant:

void TextureCubeMapArrayTextureSizeRTBase::deleteTestSpecificObjects(void)
{
	/* Get GL entry points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Reset GL state */
	gl.bindFramebuffer(GL_READ_FRAMEBUFFER, 0);
	gl.activeTexture(GL_TEXTURE0);
	gl.bindTexture(GL_TEXTURE_2D, 0);
	gl.activeTexture(GL_TEXTURE1);
	gl.bindTexture(GL_TEXTURE_2D, 0);
	gl.activeTexture(GL_TEXTURE0);

	/* Delete GL objects */
	if (m_read_fbo_id != 0)
	{
		gl.deleteFramebuffers(1, &m_read_fbo_id);
		m_read_fbo_id = 0;
	}

	if (m_rt_std_id != 0)
	{
		gl.deleteTextures(1, &m_rt_std_id);
		m_rt_std_id = 0;
	}

	if (m_rt_shw_id != 0)
	{
		gl.deleteTextures(1, &m_rt_shw_id);
		m_rt_shw_id = 0;
	}
}